

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O3

string * ApprovalTests::getOsPrefix_abi_cxx11_(void)

{
  bool bVar1;
  string *in_RDI;
  
  bVar1 = SystemUtils::isMacOs();
  if (bVar1) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  else {
    SystemUtils::isWindowsOs();
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  ::std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string getOsPrefix()
    {
        if (SystemUtils::isMacOs())
        {
            return "Mac::";
        }

        if (SystemUtils::isWindowsOs())
        {
            return "Windows::";
        }

        return "Linux::";
    }